

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<double>::CheckTypeCompatibility
          (TPZSkylMatrix<double> *this,TPZMatrix<double> *A,TPZMatrix<double> *B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  if (A == (TPZMatrix<double> *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(A,&TPZMatrix<double>::typeinfo,&typeinfo,0);
  }
  if ((B == (TPZMatrix<double> *)0x0) ||
     (lVar3 = __dynamic_cast(B,&TPZMatrix<double>::typeinfo,&typeinfo,0), lVar2 == 0 || lVar3 == 0))
  {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "auto TPZSkylMatrix<double>::CheckTypeCompatibility(const TPZMatrix<double> *, const TPZMatrix<double> *)::(anonymous class)::operator()() const [TVar = double]"
               ,0x9f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\nERROR: incompatible matrices\n.Aborting...\n",0x2b);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.cpp"
               ,0x57);
  }
  lVar1 = *(long *)(lVar2 + 0x10);
  if (lVar1 < 1) {
    return;
  }
  lVar4 = 0;
  bVar7 = false;
  do {
    while (bVar7) {
      lVar4 = lVar4 + 1;
      bVar7 = true;
      if (lVar4 == lVar1) {
LAB_00cbd725:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "auto TPZSkylMatrix<double>::CheckTypeCompatibility(const TPZMatrix<double> *, const TPZMatrix<double> *)::(anonymous class)::operator()() const [TVar = double]"
                   ,0x9f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\nERROR: incompatible matrices\n.Aborting...\n",0x2b);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.cpp"
                   ,0x57);
      }
    }
    lVar5 = *(long *)(*(long *)(lVar2 + 0x28) + 8 + lVar4 * 8) -
            *(long *)(*(long *)(lVar2 + 0x28) + lVar4 * 8);
    lVar6 = *(long *)(*(long *)(lVar3 + 0x28) + 8 + lVar4 * 8) -
            *(long *)(*(long *)(lVar3 + 0x28) + lVar4 * 8);
    bVar7 = lVar5 != lVar6;
    lVar4 = lVar4 + 1;
  } while (lVar4 != lVar1);
  if (lVar5 == lVar6) {
    return;
  }
  goto LAB_00cbd725;
}

Assistant:

void TPZSkylMatrix<TVar>::CheckTypeCompatibility(const TPZMatrix<TVar>*A,
                                                 const TPZMatrix<TVar>*B)const
{
  auto incompatSkyline = [](){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: incompatible matrices\n.Aborting...\n";
    DebugStop();
  };
  auto aPtr = dynamic_cast<const TPZSkylMatrix<TVar>*>(A);
  auto bPtr = dynamic_cast<const TPZSkylMatrix<TVar>*>(B);
  if(!aPtr || !bPtr){
    incompatSkyline();
  }

  bool check{false};
  auto ncols = aPtr->Cols();
  for(auto i = 0; i < ncols; i++){
    check = check || aPtr->Size(i) != bPtr->Size(i);
  }
  if(check) incompatSkyline();
}